

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastZ64S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  ulong *puVar4;
  ushort *puVar5;
  uint *puVar6;
  ulong hasbits_00;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar3 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  cVar1 = ptr[1];
  if ((long)cVar1 < 0) {
    pcVar3 = SingularVarBigint<long,unsigned_char,true>(msg,ptr + 1,ctx,data,table,hasbits_00);
    return pcVar3;
  }
  puVar4 = (ulong *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar4 & 7) != 0) {
    AlignFail(puVar4);
  }
  puVar5 = (ushort *)(ptr + 2);
  *puVar4 = -(ulong)((int)cVar1 & 1) ^ (ulong)(long)cVar1 >> 1;
  if (puVar5 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar2 = (uint)table->fast_idx_mask & (uint)*puVar5;
    if ((uVar2 & 7) == 0) {
      pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar2 & 0xfffffff8)))();
      return pcVar3;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar6 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar6 & 3) != 0) {
      AlignFail();
    }
    *puVar6 = *puVar6 | (uint)hasbits_00;
  }
  return (char *)puVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ64S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularVarint<int64_t, uint8_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}